

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# page_heap.cc
# Opt level: O0

void __thiscall tcmalloc::PageHeap::RemoveFromFreeList(PageHeap *this,Span *span)

{
  SpanSetIter __position;
  SpanSetIter iter;
  SpanSet *set;
  Span *span_local;
  PageHeap *this_local;
  
  if ((*(uint *)&span->field_0x28 >> 0x18 & 3) == 1) {
    (this->stats_).free_bytes = (this->stats_).free_bytes + span->length * -0x2000;
  }
  else {
    (this->stats_).unmapped_bytes = (this->stats_).unmapped_bytes + span->length * -0x2000;
  }
  if (span->length < 0x81) {
    DLL_Remove(span);
  }
  else {
    iter._M_node = (_Base_ptr)&this->large_normal_;
    if ((*(uint *)&span->field_0x28 >> 0x18 & 3) == 2) {
      iter._M_node = (_Base_ptr)&this->large_returned_;
    }
    __position = Span::ExtractSpanSetIterator(span);
    std::
    set<tcmalloc::SpanPtrWithLength,tcmalloc::SpanBestFitLess,tcmalloc::STLPageHeapAllocator<tcmalloc::SpanPtrWithLength,void>>
    ::erase_abi_cxx11_((set<tcmalloc::SpanPtrWithLength,tcmalloc::SpanBestFitLess,tcmalloc::STLPageHeapAllocator<tcmalloc::SpanPtrWithLength,void>>
                        *)iter._M_node,(const_iterator)__position._M_node);
  }
  return;
}

Assistant:

void PageHeap::RemoveFromFreeList(Span* span) {
  ASSERT(lock_.IsHeld());
  ASSERT(span->location != Span::IN_USE);
  if (span->location == Span::ON_NORMAL_FREELIST) {
    stats_.free_bytes -= (span->length << kPageShift);
  } else {
    stats_.unmapped_bytes -= (span->length << kPageShift);
  }
  if (span->length > kMaxPages) {
    SpanSet *set = &large_normal_;
    if (span->location == Span::ON_RETURNED_FREELIST)
      set = &large_returned_;
    SpanSetIter iter = span->ExtractSpanSetIterator();
    ASSERT(iter->span == span);
    ASSERT(set->find(SpanPtrWithLength(span)) == iter);
    set->erase(iter);
  } else {
    DLL_Remove(span);
  }
}